

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.cc
# Opt level: O3

string * __thiscall
cnn::mp::ElapsedTimeString_abi_cxx11_
          (string *__return_storage_ptr__,mp *this,timespec *start,timespec *end)

{
  ostream *poVar1;
  ostringstream ss;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::ostream::_M_insert<long>((long)aoStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds and ",0xd);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"nseconds",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ElapsedTimeString(const timespec& start, const timespec& end) {
      std::ostringstream ss;
      time_t secs = end.tv_sec - start.tv_sec;
      long nsec = end.tv_nsec - start.tv_nsec;
      ss << secs << " seconds and " << nsec << "nseconds";
      return ss.str();
    }